

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

item_accessor * __thiscall
pybind11::detail::object_api<pybind11::handle>::operator[]
          (object_api<pybind11::handle> *this,char *key)

{
  handle *phVar1;
  object_api<pybind11::handle> *in_RSI;
  item_accessor *in_RDI;
  object *in_stack_ffffffffffffff98;
  accessor<pybind11::detail::accessor_policies::generic_item> *this_00;
  handle obj;
  char *in_stack_ffffffffffffffb8;
  str *in_stack_ffffffffffffffc0;
  accessor<pybind11::detail::accessor_policies::generic_item> local_30;
  
  obj.m_ptr = (PyObject *)in_RDI;
  phVar1 = derived(in_RSI);
  local_30.key.super_handle.m_ptr = (handle)phVar1->m_ptr;
  this_00 = &local_30;
  str::str(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  object::object((object *)in_RDI,in_stack_ffffffffffffff98);
  accessor<pybind11::detail::accessor_policies::generic_item>::accessor
            (this_00,obj,(key_type *)in_RDI);
  object::~object((object *)0x198a3a);
  str::~str((str *)0x198a44);
  return in_RDI;
}

Assistant:

item_accessor object_api<D>::operator[](const char *key) const {
    return {derived(), pybind11::str(key)};
}